

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::internal::
       parse_precision<char,fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
                 *handler)

{
  char *pcVar1;
  char cVar2;
  type tVar3;
  int iVar4;
  char *local_20;
  precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
  local_18;
  
  local_20 = begin + 1;
  if (local_20 == end) {
    iVar4 = 0;
  }
  else {
    iVar4 = (int)*local_20;
  }
  if (iVar4 - 0x30U < 10) {
    iVar4 = parse_nonnegative_int<char,fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&>
                      (&local_20,end,handler);
    ((handler->
     super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
     ).super_specs_setter<char>.specs_)->precision = iVar4;
  }
  else {
    if (iVar4 != 0x7b) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                 ).context_,"missing precision specifier");
    }
    local_20 = begin + 2;
    if (local_20 != end) {
      local_18.handler = handler;
      local_20 = parse_arg_id<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&,char>>
                           (local_20,end,&local_18);
    }
    if ((local_20 == end) ||
       (pcVar1 = local_20 + 1, cVar2 = *local_20, local_20 = pcVar1, cVar2 != '}')) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                 ).context_,"invalid format string");
    }
  }
  tVar3 = (handler->checker_).arg_type_;
  if ((tVar3 != pointer_type) && (8 < tVar3 - named_arg_type)) {
    return local_20;
  }
  error_handler::on_error
            ((error_handler *)((handler->checker_).error_handler_)->context_,
             "precision not allowed for this argument type");
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}